

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip.c
# Opt level: O2

_Bool lrtr_ip_addr_is_zero(lrtr_ip_addr prefix)

{
  _Bool _Var1;
  long in_FS_OFFSET;
  int in_stack_00000008;
  int in_stack_0000000c;
  
  if (in_stack_00000008 == 1) {
    if ((((in_stack_0000000c == 0) && (prefix.ver == LRTR_IPV4)) && (prefix.u.addr6.addr[0] == 0))
       && (_Var1 = true, prefix.u.addr6.addr[1] == 0)) goto LAB_00106e3a;
  }
  else if (in_stack_0000000c == 0) {
    _Var1 = true;
    goto LAB_00106e3a;
  }
  _Var1 = false;
LAB_00106e3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return _Var1;
}

Assistant:

bool lrtr_ip_addr_is_zero(const struct lrtr_ip_addr prefix)
{
	if (prefix.ver == LRTR_IPV6) {
		if (prefix.u.addr6.addr[0] == 0 && prefix.u.addr6.addr[1] == 0 && prefix.u.addr6.addr[2] == 0 &&
		    prefix.u.addr6.addr[3] == 0) {
			return true;
		}
	} else if (prefix.u.addr4.addr == 0) {
		return true;
	}

	return false;
}